

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O3

MPP_RET mpp_parser_reset(Parser prs)

{
  MPP_RET MVar1;
  
  if (prs == (Parser)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input\n","mpp_parser_reset");
    return MPP_ERR_NULL_PTR;
  }
  if (*(code **)(*prs + 0x38) != (code *)0x0) {
    MVar1 = (**(code **)(*prs + 0x38))(*(undefined8 *)((long)prs + 8));
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_parser_reset(Parser prs)
{
    if (NULL == prs) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ParserImpl *p = (ParserImpl *)prs;
    if (!p->api->reset)
        return MPP_OK;

    return p->api->reset(p->ctx);
}